

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_failure.c
# Opt level: O0

ssize_t my_write(archive *a,void *_private,void *buff,size_t s)

{
  my_data *private;
  size_t s_local;
  void *buff_local;
  void *_private_local;
  archive *a_local;
  
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_open_failure.c"
                      ,L':',0x75bcd15,"MAGIC",(long)*_private,"private->magic",(void *)0x0);
  *(int *)((long)_private + 0x10) = *(int *)((long)_private + 0x10) + 1;
  return (long)*(int *)((long)_private + 0xc);
}

Assistant:

static ssize_t
my_write(struct archive *a, void *_private, const void *buff, size_t s)
{
	struct my_data *private = (struct my_data *)_private;
	(void)a; /* UNUSED */
	(void)buff; /* UNUSED */
	(void)s; /* UNUSED */
	assertEqualInt(MAGIC, private->magic);
	++private->write_called;
	return (private->write_return);
}